

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O3

int lws_write_numeric_address(uint8_t *ads,int size,char *buf,size_t len)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ushort uVar5;
  char *pcVar6;
  char *str;
  char cVar7;
  long lVar8;
  undefined4 local_54;
  int local_38;
  
  if (size == 4) {
    local_38 = lws_snprintf(buf,len,"%u.%u.%u.%u",(ulong)*ads,(ulong)ads[1],(ulong)ads[2],
                            (uint)ads[3]);
  }
  else {
    local_38 = -1;
    if (size == 0x10) {
      pcVar6 = buf + len;
      local_54 = 0xffffffff;
      bVar1 = false;
      lVar8 = 0;
      bVar2 = false;
      bVar3 = false;
      str = buf;
      do {
        if (pcVar6 < str + 8) {
          return -1;
        }
        uVar5 = *(ushort *)(ads + lVar8 * 2) << 8 | *(ushort *)(ads + lVar8 * 2) >> 8;
        if (bVar3) {
          if (uVar5 != 0) {
            *str = ':';
            str = str + 1;
          }
LAB_001133fa:
          cVar7 = (char)lVar8;
          if (bVar1) {
            iVar4 = lws_snprintf(str,(long)pcVar6 - (long)str,"%u.%u",(ulong)ads[lVar8 * 2],
                                 (ulong)ads[lVar8 * 2 + 1]);
            str = str + (char)iVar4;
            bVar1 = true;
            if (cVar7 == '\x06') {
              *str = '.';
              str = str + 1;
            }
          }
          else if ((bVar3) && (uVar5 == 0)) {
LAB_0011346c:
            bVar1 = false;
          }
          else {
            if (cVar7 != '\0') {
              *str = ':';
              str = str + 1;
            }
            bVar1 = false;
            iVar4 = lws_snprintf(str,(long)pcVar6 - (long)str,"%x",(ulong)uVar5);
            str = str + iVar4;
            if ((bVar3) && (uVar5 != 0)) {
              if (((char)local_54 != '\0' || cVar7 != '\x05') || uVar5 != 0xffff) {
                bVar3 = false;
                goto LAB_0011346c;
              }
              *str = ':';
              str = str + 1;
              bVar1 = true;
              bVar3 = false;
              local_54 = 0;
            }
          }
        }
        else {
          if ((bVar2) || (uVar5 != 0)) goto LAB_001133fa;
          bVar3 = true;
          local_54 = (undefined4)lVar8;
          bVar2 = true;
        }
        lVar8 = lVar8 + 1;
      } while ((char)lVar8 != '\b');
      local_38 = -1;
      if (str + 3 <= pcVar6) {
        if (bVar3) {
          str[0] = ':';
          str[1] = ':';
          str[2] = '\0';
          str = str + 2;
        }
        local_38 = (int)buf;
        local_38 = (int)str - local_38;
      }
    }
  }
  return local_38;
}

Assistant:

int
lws_write_numeric_address(const uint8_t *ads, int size, char *buf, size_t len)
{
	char c, elided = 0, soe = 0, zb = -1, n, ipv4 = 0;
	const char *e = buf + len;
	char *obuf = buf;
	int q = 0;

	if (size == 4)
		return lws_snprintf(buf, len, "%u.%u.%u.%u",
				    ads[0], ads[1], ads[2], ads[3]);

	if (size != 16)
		return -1;

	for (c = 0; c < (char)size / 2; c++) {
		uint16_t v = (ads[q] << 8) | ads[q + 1];

		if (buf + 8 > e)
			return -1;

		q += 2;
		if (soe) {
			if (v)
				*buf++ = ':';
				/* fall thru to print hex value */
		} else
			if (!elided && !soe && !v) {
				elided = soe = 1;
				zb = c;
				continue;
			}

		if (ipv4) {
			n = lws_snprintf(buf, e - buf, "%u.%u",
					ads[q - 2], ads[q - 1]);
			buf += n;
			if (c == 6)
				*buf++ = '.';
		} else {
			if (soe && !v)
				continue;
			if (c)
				*buf++ = ':';

			buf += lws_snprintf(buf, e - buf, "%x", v);

			if (soe && v) {
				soe = 0;
				if (c == 5 && v == 0xffff && !zb) {
					ipv4 = 1;
					*buf++ = ':';
				}
			}
		}
	}
	if (buf + 3 > e)
		return -1;

	if (soe) { /* as is the case for all zeros */
		*buf++ = ':';
		*buf++ = ':';
		*buf = '\0';
	}

	return lws_ptr_diff(buf, obuf);
}